

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

char * vkt::wsi::anon_unknown_0::getTestDimensionName(TestDimension dimension)

{
  char **ppcVar1;
  TestDimension dimension_local;
  
  ppcVar1 = de::getSizedArrayElement<10,10,char_const*>(&getTestDimensionName::s_names,dimension);
  return *ppcVar1;
}

Assistant:

const char* getTestDimensionName (TestDimension dimension)
{
	static const char* const s_names[] =
	{
		"min_image_count",
		"image_format",
		"image_extent",
		"image_array_layers",
		"image_usage",
		"image_sharing_mode",
		"pre_transform",
		"composite_alpha",
		"present_mode",
		"clipped"
	};
	return de::getSizedArrayElement<TEST_DIMENSION_LAST>(s_names, dimension);
}